

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fverb.cpp
# Opt level: O0

float __thiscall Fverb::get_parameter(Fverb *this,uint index)

{
  type pBVar1;
  mydsp *dsp;
  uint index_local;
  Fverb *this_local;
  
  pBVar1 = std::unique_ptr<Fverb::BasicDsp,_std::default_delete<Fverb::BasicDsp>_>::operator*
                     (&this->fDsp);
  switch(index) {
  case 0:
    this_local._4_4_ = *(float *)((long)&pBVar1[0x10007]._vptr_BasicDsp + 4);
    break;
  case 1:
    this_local._4_4_ = *(float *)&pBVar1[5]._vptr_BasicDsp;
    break;
  case 2:
    this_local._4_4_ = *(float *)((long)&pBVar1[0x10009]._vptr_BasicDsp + 4);
    break;
  case 3:
    this_local._4_4_ = *(float *)&pBVar1[0x1000c]._vptr_BasicDsp;
    break;
  case 4:
    this_local._4_4_ = *(float *)((long)&pBVar1[0x1000e]._vptr_BasicDsp + 4);
    break;
  case 5:
    this_local._4_4_ = *(float *)&pBVar1[0x10413]._vptr_BasicDsp;
    break;
  case 6:
    this_local._4_4_ = *(float *)&pBVar1[0x11018]._vptr_BasicDsp;
    break;
  case 7:
    this_local._4_4_ = *(float *)((long)&pBVar1[2]._vptr_BasicDsp + 4);
    break;
  case 8:
    this_local._4_4_ = *(float *)&pBVar1[0x25024]._vptr_BasicDsp;
    break;
  case 9:
    this_local._4_4_ = *(float *)&pBVar1[0x2101b]._vptr_BasicDsp;
    break;
  case 10:
    this_local._4_4_ = *(float *)((long)&pBVar1[0x21019]._vptr_BasicDsp + 4);
    break;
  default:
    this_local._4_4_ = 0.0;
  }
  return this_local._4_4_;
}

Assistant:

float Fverb::get_parameter(unsigned index) const noexcept
{
    mydsp &dsp = static_cast<mydsp &>(*fDsp);
    switch (index) {

    case 0:
        return dsp.fHslider2;

    case 1:
        return dsp.fHslider1;

    case 2:
        return dsp.fHslider3;

    case 3:
        return dsp.fHslider4;

    case 4:
        return dsp.fHslider5;

    case 5:
        return dsp.fHslider6;

    case 6:
        return dsp.fHslider7;

    case 7:
        return dsp.fHslider0;

    case 8:
        return dsp.fHslider10;

    case 9:
        return dsp.fHslider9;

    case 10:
        return dsp.fHslider8;

    default:
        (void)dsp;
        return 0;
    }
}